

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::
     format<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string,std::__cxx11::string,long>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               long *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               long *args_5)

{
  long in_FS_OFFSET;
  FormatList local_b0;
  FormatArg local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  code *local_80;
  code *local_78;
  long *local_70;
  code *local_68;
  code *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  code *local_50;
  code *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  code *local_38;
  code *local_30;
  long *local_28;
  code *local_20;
  code *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0.m_args = &local_a0;
  local_b0.m_N = 6;
  local_a0.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_a0.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_80 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_78 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_68 = detail::FormatArg::formatImpl<long>;
  local_60 = detail::FormatArg::toIntImpl<long>;
  local_50 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_48 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_40 = args_4;
  local_38 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_30 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_28 = args_5;
  local_20 = detail::FormatArg::formatImpl<long>;
  local_18 = detail::FormatArg::toIntImpl<long>;
  local_a0.m_value = args;
  local_88 = args_1;
  local_70 = args_2;
  local_58 = args_3;
  vformat(out,fmt,&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}